

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void rtosc::path_search(Ports *root,char *str,char *needle,char *types,size_t max_types,
                       rtosc_arg_t *args,size_t max_args,path_search_opts opts,bool reply_with_query
                       )

{
  pointer pPVar1;
  char *pcVar2;
  char *__s2;
  long lVar3;
  rtosc_arg_t *prVar4;
  int iVar5;
  Port *p_00;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  my_array<rtosc_arg_t,_2UL> *__i;
  rtosc_arg_t *prVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Port *p;
  pointer p_01;
  long lVar14;
  size_t max;
  size_t local_b8;
  rtosc_arg_t *local_b0;
  size_t local_a8;
  long local_a0;
  ulong local_98;
  char *local_90;
  char *local_88;
  ulong local_80;
  size_t local_78;
  anon_class_40_5_2428ddf5 local_70;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = needle;
  if (needle == (char *)0x0) {
    local_88 = "";
  }
  pcVar2 = local_88;
  uVar11 = max_types - 1;
  if (max_args <= max_types - 1) {
    uVar11 = max_args;
  }
  local_b8 = 0;
  local_b0 = args;
  local_90 = types;
  local_78 = uVar11;
  memset(types,0,uVar11 + 1);
  memset(args,0,uVar11);
  if (reply_with_query) {
    *types = 's';
    args->s = str;
    types[1] = 's';
    local_b8 = 2;
    args[1].s = pcVar2;
  }
  if ((*str != '\0') && ((*str != '/' || (str[1] != '\0')))) {
    p_00 = Ports::apropos(root,str);
    if (p_00 == (Port *)0x0) goto LAB_001066ba;
    root = p_00->ports;
    local_70.needle = &local_88;
    local_70.types = &local_90;
    local_70.args = &local_b0;
    local_70.max = &local_78;
    if (root == (Ports *)0x0) {
      local_70.pos = &local_b8;
      path_search::anon_class_40_5_2428ddf5::operator()(&local_70,p_00);
      goto LAB_001066ba;
    }
  }
  local_70.max = &local_78;
  local_70.args = &local_b0;
  local_70.types = &local_90;
  local_70.needle = &local_88;
  local_70.pos = &local_b8;
  p_01 = (root->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
         super__Vector_impl_data._M_start;
  pPVar1 = (root->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (p_01 != pPVar1) {
    do {
      path_search::anon_class_40_5_2428ddf5::operator()(&local_70,p_01);
      p_01 = p_01 + 1;
    } while (p_01 != pPVar1);
  }
LAB_001066ba:
  prVar4 = local_b0;
  sVar8 = local_b8;
  if (opts - sorted < 2) {
    uVar11 = local_b8 >> 1;
    uVar13 = uVar11 * 0x20;
    if (1 < local_b8) {
      prVar9 = local_b0 + uVar11 * 2;
      lVar14 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<my_array<rtosc_arg_t,2ul>*,long,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                (local_b0,prVar9,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
      if (uVar13 < 0x201) {
        std::
        __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                  (prVar4,prVar9);
      }
      else {
        prVar9 = prVar4 + 0x20;
        std::
        __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                  (prVar4,prVar9);
        if (uVar11 != 0x10) {
          lVar14 = uVar13 - 0x200;
          do {
            std::
            __unguarded_linear_insert<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Val_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                      (prVar9);
            prVar9 = prVar9 + 2;
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != 0);
        }
      }
    }
    if (opts == sorted_and_unique_prefix) {
      if (sVar8 < 4) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(local_b0->s);
      }
      local_48 = sVar8;
      uVar12 = sVar8 & 0xfffffffffffffffe;
      local_b8 = 2;
      local_40 = uVar13;
      local_38 = uVar11;
      if (uVar12 < 3) {
        local_a0 = 0;
      }
      else {
        local_a0 = 0;
        uVar11 = 0;
        local_a8 = sVar6;
        local_98 = uVar12;
        do {
          prVar4 = local_b0;
          sVar8 = local_b8;
          pcVar2 = local_b0[local_b8].s;
          local_80 = uVar11;
          sVar7 = strlen(pcVar2);
          sVar6 = local_a8;
          sVar10 = sVar8;
          if (local_a8 < sVar7) {
            __s2 = prVar4[local_80].s;
            iVar5 = strncmp(pcVar2,__s2,local_a8);
            uVar12 = local_98;
            if ((iVar5 == 0) && (__s2[sVar6 - 1] == '/')) {
              prVar4[sVar8].d = 0.0;
              local_a0 = local_a0 + 1;
              sVar8 = local_80;
              sVar10 = local_b8;
              sVar7 = local_a8;
            }
          }
          local_a8 = sVar7;
          local_b8 = sVar10 + 2;
          uVar11 = sVar8;
        } while (local_b8 < uVar12);
      }
      uVar13 = local_38;
      uVar11 = local_40;
      prVar4 = local_b0;
      if (1 < local_48) {
        lVar14 = (long)local_b0 + local_40;
        lVar3 = 0x3f;
        if (local_38 != 0) {
          for (; local_38 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<my_array<rtosc_arg_t,2ul>*,long,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                  (local_b0,lVar14,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar11 < 0x201) {
          std::
          __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                    (prVar4,lVar14);
        }
        else {
          prVar9 = prVar4 + 0x20;
          std::
          __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                    (prVar4,prVar9);
          if (uVar13 != 0x10) {
            lVar14 = uVar11 - 0x200;
            do {
              std::
              __unguarded_linear_insert<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Val_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                        (prVar9);
              prVar9 = prVar9 + 2;
              lVar14 = lVar14 + -0x20;
            } while (lVar14 != 0);
          }
        }
      }
      local_90[(uVar13 - local_a0) * 2] = '\0';
    }
  }
  return;
}

Assistant:

void rtosc::path_search(const rtosc::Ports& root,
                        const char *str, const char* needle,
                        char *types, std::size_t max_types,
                        rtosc_arg_t* args, std::size_t max_args,
                        path_search_opts opts, bool reply_with_query)
{
    using rtosc::Ports;
    using rtosc::Port;

    if(!needle)
        needle = "";

    // the last char of "types" is being used for a terminating 0
    std::size_t  max         = std::min(max_types - 1, max_args);
    size_t       pos         = 0;
    const Ports *ports       = nullptr;
    const Port  *single_port = nullptr;

    //zero out data
    memset(types, 0, max + 1);
    memset(args,  0, max);

    if(reply_with_query) {
        assert(max >= 2);
        types[pos]    = 's';
        args[pos++].s = str;
        types[pos]    = 's';
        args[pos++].s = needle;
    }

    if(!*str || !strcmp(str, "/")) {
        ports = &root;
    } else {
        const Port *port = root.apropos(str);
        //fprintf(stderr, "apropos %s -> %s\n",str,port?port->name:"<no result>");
        if(port) {
            if(port->ports) {
                ports = port->ports;
            } else {
                single_port = port;
            }
        }
    }

    const auto fn = [&pos,&needle,&types,&args,&max](const Port& p)
    {
#ifdef NDEBUG
        (void)max;
#else
        assert(pos < max);
#endif
        //fprintf(stderr, "path search iterating port: %s (needle %s) (pos %d)\n", p.name, needle, (int)pos);
        if(p.name && strstr(p.name, needle) == p.name)
        {
            types[pos]    = 's';
            args[pos++].s = p.name;
            types[pos]    = 'b';
            if(p.metadata && *p.metadata) {
                args[pos].b.data = (unsigned char*) p.metadata;
                auto tmp = rtosc::Port::MetaContainer(p.metadata);
                args[pos++].b.len  = tmp.length();
            } else {
                args[pos].b.data = (unsigned char*) NULL;
                args[pos++].b.len  = 0;
            }
        }
    };

    if(ports)
        for(const Port &p:*ports) fn(p);
    else if(single_port)
        fn(*single_port);

    if (opts == path_search_opts::sorted ||
        opts == path_search_opts::sorted_and_unique_prefix)
    {
        // we could use std::array, but its internal array does not necessarily
        // have offset 0
        using val_on_2 = my_array<rtosc_arg_t, 2>;
        using ptr_on_2 = val_on_2*;
        auto is_less = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
            return strcmp(p1[0].s, p2[0].s) < 0;
        };
        std::size_t n_paths_found = pos >> 1;
        std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less);

        if (opts == path_search_opts::sorted_and_unique_prefix)
        {
            std::size_t prev_pos = 0;
            std::size_t strlen_prev = n_paths_found > 1 ? strlen(args[prev_pos].s) : 0;
            std::size_t unused_paths = 0;
            for(pos = 2; pos < (n_paths_found<<1); ++++pos)
            {
                assert(args[prev_pos].s); // invariant

                // is the prev path a (real) sub-path of this path?
                // i.e. the current can be accessed by recursing into the prev?
                if(strlen_prev < strlen(args[pos].s) &&
                   0 == strncmp(args[pos].s, args[prev_pos].s, strlen_prev) &&
                   args[prev_pos].s[strlen_prev-1] == '/')
                {
                    // then mark this as unused
                    args[pos].s = nullptr;
                    ++unused_paths;
                }
                else
                {
                    prev_pos = pos;
                    strlen_prev = strlen(args[prev_pos].s);
                }
            }

            // another sort, only to move unused paths to the end
            auto is_less_2 = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
                return (!(p1[0].s)) ? false // move p1 to the end
                                    : (!(p2[0].s)) ? true // move p2 to the end
                                                   // is actually already sorted:
                                                   : (strcmp(p1[0].s, p2[0].s) < 0);
            };
            std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less_2);

            // cut off unused paths
            types[(n_paths_found - unused_paths)<<1] = 0;
        }
    }
}